

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_graph_print(ggml_cgraph *cgraph)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int64_t iVar5;
  char *pcVar6;
  ggml_tensor *pgVar7;
  char *pcVar8;
  long in_RDI;
  ggml_tensor *node_1;
  int i_1;
  ggml_tensor *node;
  int i;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar9;
  ggml_cgraph *in_stack_ffffffffffffff90;
  int64_t iVar10;
  char *local_58;
  uint local_1c;
  uint local_c;
  
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"=== GRAPH ===\n");
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"n_nodes = %d\n",(ulong)*(uint *)(in_RDI + 4));
  for (local_c = 0; (int)local_c < *(int *)(in_RDI + 4); local_c = local_c + 1) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x10) + (long)(int)local_c * 8);
    uVar2 = *(undefined8 *)(lVar1 + 0x10);
    uVar3 = *(undefined8 *)(lVar1 + 0x18);
    uVar4 = *(undefined8 *)(lVar1 + 0x20);
    pcVar6 = ggml_op_name(*(ggml_op *)(lVar1 + 0x50));
    if ((*(uint *)(lVar1 + 0x94) & 4) == 0) {
      pgVar7 = ggml_graph_get_grad(in_stack_ffffffffffffff90,
                                   (ggml_tensor *)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_58 = " ";
      if (pgVar7 != (ggml_tensor *)0x0) {
        local_58 = "g";
      }
    }
    else {
      local_58 = "x";
    }
    ggml_log_internal(GGML_LOG_LEVEL_INFO," - %3d: [ %5ld, %5ld, %5ld] %16s %s\n",(ulong)local_c,
                      uVar2,uVar3,uVar4,pcVar6,local_58);
  }
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"n_leafs = %d\n",(ulong)*(uint *)(in_RDI + 8));
  for (local_1c = 0; (int)local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
    pgVar7 = *(ggml_tensor **)(*(long *)(in_RDI + 0x28) + (long)(int)local_1c * 8);
    iVar10 = pgVar7->ne[0];
    iVar5 = pgVar7->ne[1];
    uVar9 = local_1c;
    pcVar6 = ggml_op_name(pgVar7->op);
    pcVar8 = ggml_get_name(pgVar7);
    ggml_log_internal(GGML_LOG_LEVEL_INFO," - %3d: [ %5ld, %5ld] %8s %16s\n",(ulong)uVar9,iVar10,
                      iVar5,pcVar6,pcVar8);
  }
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"========================================\n");
  return;
}

Assistant:

void ggml_graph_print(const struct ggml_cgraph * cgraph) {
    GGML_LOG_INFO("=== GRAPH ===\n");

    GGML_LOG_INFO("n_nodes = %d\n", cgraph->n_nodes);
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        GGML_LOG_INFO(" - %3d: [ %5" PRId64 ", %5" PRId64 ", %5" PRId64 "] %16s %s\n",
                i,
                node->ne[0], node->ne[1], node->ne[2],
                ggml_op_name(node->op), (node->flags & GGML_TENSOR_FLAG_PARAM) ? "x" :
                      ggml_graph_get_grad(cgraph, node) ? "g" : " ");
    }

    GGML_LOG_INFO("n_leafs = %d\n", cgraph->n_leafs);
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * node = cgraph->leafs[i];

        GGML_LOG_INFO(" - %3d: [ %5" PRId64 ", %5" PRId64 "] %8s %16s\n",
                i,
                node->ne[0], node->ne[1],
                ggml_op_name(node->op),
                ggml_get_name(node));
    }

    GGML_LOG_INFO("========================================\n");
}